

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
::try_emplace_impl<std::__cxx11::string>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  tuple<> local_21;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&> local_20
  ;
  
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
              *)this);
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
  ::find_or_prepare_insert_non_soo<std::__cxx11::string>
            (__return_storage_ptr__,
             (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
              *)this,k);
  if (__return_storage_ptr__->second == true) {
    local_20.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
            )k;
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
    ::emplace_at<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string&&>,std::tuple<>>
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
                *)this,__return_storage_ptr__->first,
               (piecewise_construct_t *)&std::piecewise_construct,&local_20,&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }